

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.cxx
# Opt level: O0

void __thiscall
ArgumentParser::Instance::Bind
          (Instance *this,
          NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *val)

{
  ExpectAtLeast local_50;
  anon_class_16_2_633bb64e local_48;
  function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>)>
  local_38;
  NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *val_local;
  Instance *this_local;
  
  local_48.this = this;
  local_48.val = val;
  local_18 = val;
  val_local = (NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this;
  std::function<ArgumentParser::Continue(std::basic_string_view<char,std::char_traits<char>>)>::
  function<ArgumentParser::Instance::Bind(ArgumentParser::NonEmpty<std::__cxx11::string>&)::__0,void>
            ((function<ArgumentParser::Continue(std::basic_string_view<char,std::char_traits<char>>)>
              *)&local_38,&local_48);
  ExpectAtLeast::ExpectAtLeast(&local_50,1);
  Bind(this,&local_38,local_50);
  std::function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>)>::
  ~function(&local_38);
  return;
}

Assistant:

void Instance::Bind(NonEmpty<std::string>& val)
{
  this->Bind(
    [this, &val](cm::string_view arg) -> Continue {
      if (arg.empty() && this->ParseResults) {
        this->ParseResults->AddKeywordError(this->Keyword,
                                            "  empty string not allowed\n");
      }
      val.assign(std::string(arg));
      return Continue::No;
    },
    ExpectAtLeast{ 1 });
}